

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  ImRect *pIVar1;
  ImVec2 *pIVar2;
  undefined8 *puVar3;
  int iVar4;
  ImGuiTabBar *pIVar5;
  int iVar6;
  ImGuiTabBar *pIVar7;
  int iVar8;
  int iVar9;
  
  iVar4 = this->FreeIdx;
  iVar6 = (this->Buf).Size;
  if (iVar4 == iVar6) {
    iVar8 = iVar4 + 1;
    iVar9 = (this->Buf).Capacity;
    iVar6 = iVar8;
    if (iVar9 <= iVar4) {
      if (iVar9 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar9 / 2 + iVar9;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      pIVar7 = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar9 << 7);
      pIVar5 = (this->Buf).Data;
      if (pIVar5 != (ImGuiTabBar *)0x0) {
        memcpy(pIVar7,pIVar5,(long)(this->Buf).Size << 7);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = pIVar7;
      (this->Buf).Capacity = iVar9;
      iVar6 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar8;
  }
  else {
    if (iVar6 <= iVar4) goto LAB_0016471d;
    iVar6 = (this->Buf).Data[iVar4].Tabs.Size;
  }
  this->FreeIdx = iVar6;
  pIVar7 = (this->Buf).Data;
  pIVar1 = &pIVar7[iVar4].BarRect;
  (pIVar1->Min).x = 0.0;
  (pIVar1->Min).y = 0.0;
  (pIVar1->Max).x = 0.0;
  (pIVar1->Max).y = 0.0;
  pIVar5 = pIVar7 + iVar4;
  (pIVar5->Tabs).Size = 0;
  (pIVar5->Tabs).Capacity = 0;
  (pIVar5->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar5 = pIVar7 + iVar4;
  pIVar5->ID = 0;
  pIVar5->SelectedTabId = 0;
  *(undefined8 *)(&pIVar5->ID + 2) = 0;
  pIVar2 = &pIVar7[iVar4].FramePadding;
  pIVar2->x = 0.0;
  pIVar2->y = 0.0;
  pIVar2[1].x = 0.0;
  pIVar2[1].y = 0.0;
  pIVar7[iVar4].TabsNames.Buf.Data = (char *)0x0;
  pIVar7[iVar4].CurrFrameVisible = -1;
  pIVar7[iVar4].PrevFrameVisible = -1;
  pIVar5 = pIVar7 + iVar4;
  pIVar5->LastTabContentHeight = 0.0;
  pIVar5->OffsetMax = 0.0;
  *(undefined8 *)(&pIVar5->LastTabContentHeight + 2) = 0;
  pIVar5 = pIVar7 + iVar4;
  pIVar5->ScrollingAnim = 0.0;
  pIVar5->ScrollingTarget = 0.0;
  *(undefined8 *)(&pIVar5->ScrollingAnim + 2) = 0;
  puVar3 = (undefined8 *)((long)&pIVar7[iVar4].ScrollingTargetDistToVisibility + 3);
  *puVar3 = 0;
  puVar3[1] = 0;
  pIVar7[iVar4].LastTabItemIdx = -1;
  if (iVar4 < (this->Buf).Size) {
    return (this->Buf).Data + iVar4;
  }
LAB_0016471d:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x52e,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }